

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heartbeat_message_test.cpp
# Opt level: O2

void __thiscall
bidfx_public_api::price::pixie::HeartbeatMessageTest_test_encode_Test::TestBody
          (HeartbeatMessageTest_test_encode_Test *this)

{
  char *message;
  AssertHelper AStack_78;
  AssertionResult gtest_ar;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  ByteBuffer buffer;
  
  bidfx_public_api::price::pixie::HeartbeatMessage::HeartbeatMessage((HeartbeatMessage *)&local_60);
  bidfx_public_api::price::pixie::HeartbeatMessage::Encode((int)&buffer);
  bidfx_public_api::tools::BufferUtil::BufferAsHex_abi_cxx11_((ByteBuffer *)&local_60);
  testing::internal::CmpHelperEQ<char[3],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"48\"","BufferUtil::BufferAsHex(buffer)",(char (*) [3])"48",
             &local_60);
  std::__cxx11::string::~string((string *)&local_60);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_60);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/heartbeat_message_test.cpp"
               ,0x1f,message);
    testing::internal::AssertHelper::operator=(&AStack_78,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&AStack_78);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_60);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  bidfx_public_api::tools::ByteBuffer::~ByteBuffer(&buffer);
  return;
}

Assistant:

TEST(HeartbeatMessageTest, test_encode)
{
    ByteBuffer buffer = HeartbeatMessage().Encode(PixieVersion::CURRENT_VERSION);
    EXPECT_EQ("48", BufferUtil::BufferAsHex(buffer));
}